

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_symbol.cpp
# Opt level: O1

string * __thiscall
SymbolTableTree::GetCurrentPreviousTableName_abi_cxx11_
          (string *__return_storage_ptr__,SymbolTableTree *this)

{
  pointer ppVar1;
  pointer pcVar2;
  size_t sVar3;
  size_t __n;
  int iVar4;
  pointer ppVar5;
  
  ppVar5 = (this->m_table_tree).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolTable>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolTable>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (this->m_table_tree).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolTable>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolTable>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar5 != ppVar1) {
    pcVar2 = (this->current_table_name)._M_dataplus._M_p;
    sVar3 = (this->current_table_name)._M_string_length;
    do {
      __n = (ppVar5->first)._M_string_length;
      if (__n == sVar3) {
        if (__n == 0) break;
        iVar4 = bcmp((ppVar5->first)._M_dataplus._M_p,pcVar2,__n);
        if (iVar4 == 0) break;
      }
      ppVar5 = ppVar5 + 1;
    } while (ppVar5 != ppVar1);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar2 = (ppVar5->second).m_previous_level_name._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar2,
             pcVar2 + (ppVar5->second).m_previous_level_name._M_string_length);
  return __return_storage_ptr__;
}

Assistant:

string SymbolTableTree::GetCurrentPreviousTableName() const {
    auto iter = m_table_tree.begin();
    for (; iter != m_table_tree.end(); ++iter) {
        if (iter->first == current_table_name)
            break;
    }
    return iter->second.GetPreviousTableName();
}